

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

void __thiscall AddrManImpl::Check(AddrManImpl *this)

{
  ulong uVar1;
  uint uVar2;
  uint64_t uVar3;
  ulong unaff_R12;
  uint uVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int err;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_consistency_check_ratio != 0) {
    uVar2 = 0x20;
    uVar4 = this->m_consistency_check_ratio - 1;
    if (uVar4 != 0) {
      uVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    do {
      uVar3 = RandomMixin<FastRandomContext>::randbits
                        (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,0x20 - uVar2);
      uVar1 = unaff_R12;
      if (uVar3 <= uVar4) {
        uVar1 = uVar3;
      }
      unaff_R12 = uVar1 & 0xffffffff;
    } while (uVar4 < uVar3);
    if ((int)uVar1 < 1) {
      err = CheckAddrman(this);
      if (err != 0) {
        logging_function._M_str = "Check";
        logging_function._M_len = 5;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
        ;
        source_file._M_len = 0x5b;
        LogPrintFormatInternal<int>
                  (logging_function,source_file,0x41f,ALL,Info,(ConstevalFormatString<1U>)0x828fee,
                   &err);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                      ,0x420,"void AddrManImpl::Check() const");
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Check() const
{
    AssertLockHeld(cs);

    // Run consistency checks 1 in m_consistency_check_ratio times if enabled
    if (m_consistency_check_ratio == 0) return;
    if (insecure_rand.randrange(m_consistency_check_ratio) >= 1) return;

    const int err{CheckAddrman()};
    if (err) {
        LogPrintf("ADDRMAN CONSISTENCY CHECK FAILED!!! err=%i\n", err);
        assert(false);
    }
}